

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__resample_row_h_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  
  bVar2 = *in_near;
  if (w == 1) {
    out[1] = bVar2;
    *out = bVar2;
    return out;
  }
  *out = bVar2;
  out[1] = (stbi_uc)((uint)(ushort)bVar2 + (uint)(ushort)bVar2 * 2 + (uint)in_near[1] + 2 >> 2);
  lVar1 = (long)w + -1;
  for (lVar3 = 1; lVar3 < lVar1; lVar3 = lVar3 + 1) {
    iVar4 = (uint)in_near[lVar3] + (uint)in_near[lVar3] * 2;
    out[lVar3 * 2] = (stbi_uc)((uint)in_near[lVar3 + -1] + iVar4 + 2 >> 2);
    out[lVar3 * 2 + 1] = (stbi_uc)(iVar4 + (uint)in_near[lVar3 + 1] + 2 >> 2);
  }
  out[lVar3 * 2] =
       (stbi_uc)((uint)in_near[(long)w + -2] + (uint)in_near[(long)w + -2] * 2 +
                 (uint)in_near[lVar1] + 2 >> 2);
  out[lVar3 * 2 + 1] = in_near[lVar1];
  return out;
}

Assistant:

static stbi_uc*  stbi__resample_row_h_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate two samples horizontally for every one in input
   int i;
   stbi_uc *input = in_near;

   if (w == 1) {
      // if only one sample, can't do any interpolation
      out[0] = out[1] = input[0];
      return out;
   }

   out[0] = input[0];
   out[1] = stbi__div4(input[0]*3 + input[1] + 2);
   for (i=1; i < w-1; ++i) {
      int n = 3*input[i]+2;
      out[i*2+0] = stbi__div4(n+input[i-1]);
      out[i*2+1] = stbi__div4(n+input[i+1]);
   }
   out[i*2+0] = stbi__div4(input[w-2]*3 + input[w-1] + 2);
   out[i*2+1] = input[w-1];

   STBI_NOTUSED(in_far);
   STBI_NOTUSED(hs);

   return out;
}